

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I400ToARGBRow_C(uint8_t *src_y,uint8_t *rgb_buf,YuvConstants *yuvconstants,int width)

{
  uint in_ECX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint8_t unaff_retaddr;
  int x;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < (int)(in_ECX - 1); iVar1 = iVar1 + 2) {
    libyuv::YPixel(unaff_retaddr,in_RDI,in_RSI,in_RDX,(YuvConstants *)CONCAT44(in_ECX,iVar1));
    in_RSI[3] = 0xff;
    libyuv::YPixel(unaff_retaddr,in_RDI,in_RSI,in_RDX,(YuvConstants *)CONCAT44(in_ECX,iVar1));
    in_RSI[7] = 0xff;
    in_RDI = in_RDI + 2;
    in_RSI = in_RSI + 8;
  }
  if ((in_ECX & 1) != 0) {
    libyuv::YPixel(unaff_retaddr,in_RDI,in_RSI,in_RDX,(YuvConstants *)CONCAT44(in_ECX,iVar1));
    in_RSI[3] = 0xff;
  }
  return;
}

Assistant:

void I400ToARGBRow_C(const uint8_t* src_y,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YPixel(src_y[0], rgb_buf + 0, rgb_buf + 1, rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YPixel(src_y[1], rgb_buf + 4, rgb_buf + 5, rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_y += 2;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YPixel(src_y[0], rgb_buf + 0, rgb_buf + 1, rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}